

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptNativeIntArray::DirectGetItem(JavascriptNativeIntArray *this,uint32 index)

{
  Type nValue;
  bool bVar1;
  int iVar2;
  Type *this_00;
  JavascriptLibrary *this_01;
  JavascriptNativeIntArray *local_50;
  Var element;
  SparseArraySegmentBase *pSStack_40;
  uint32 offset;
  SparseArraySegment<int> *seg;
  JavascriptNativeIntArray *pJStack_30;
  uint32 index_local;
  JavascriptNativeIntArray *this_local;
  ScriptContext *local_20;
  Type local_14;
  JavascriptNativeIntArray *local_10;
  
  seg._4_4_ = index;
  pJStack_30 = this;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  pSStack_40 = Js::JavascriptArray::GetLastUsedSegment((JavascriptArray *)this);
  element._4_4_ = seg._4_4_ - pSStack_40->left;
  if (((seg._4_4_ < pSStack_40->left) || (pSStack_40->length <= element._4_4_)) ||
     (bVar1 = SparseArraySegment<int>::IsMissingItem((int *)(&pSStack_40[1].left + element._4_4_)),
     bVar1)) {
    local_50 = (JavascriptNativeIntArray *)0x0;
    iVar2 = (**(code **)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.
                               super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                               super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                      (this,seg._4_4_,&local_50);
    if (iVar2 == 0) {
      this_00 = RecyclableObject::GetType((RecyclableObject *)this);
      this_01 = Js::Type::GetLibrary(this_00);
      this_local = (JavascriptNativeIntArray *)
                   JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
    }
    else {
      this_local = local_50;
    }
  }
  else {
    nValue = (&pSStack_40[1].left)[element._4_4_];
    local_20 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    local_14 = nValue;
    bVar1 = TaggedInt::IsOverflow(nValue);
    if (bVar1) {
      local_10 = (JavascriptNativeIntArray *)
                 JavascriptNumber::NewInlined((double)(int)local_14,local_20);
    }
    else {
      local_10 = (JavascriptNativeIntArray *)TaggedInt::ToVarUnchecked(local_14);
    }
    this_local = local_10;
  }
  return this_local;
}

Assistant:

Var JavascriptNativeIntArray::DirectGetItem(uint32 index)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        SparseArraySegment<int32> *seg = (SparseArraySegment<int32>*)this->GetLastUsedSegment();
        uint32 offset = index - seg->left;
        if (index >= seg->left && offset < seg->length)
        {
            if (!SparseArraySegment<int32>::IsMissingItem(&seg->elements[offset]))
            {
                return JavascriptNumber::ToVar(seg->elements[offset], GetScriptContext());
            }
        }
        Var element = nullptr;
        if (DirectGetItemAtFull(index, &element))
        {
            return element;
        }
        return GetType()->GetLibrary()->GetUndefined();
    }